

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsBandDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,ARKodeMem ark_mem,
                  ARKLsMem arkls_mem,ARKRhsFn fi,N_Vector tmp1,N_Vector tmp2)

{
  double dVar1;
  sunindextype sVar2;
  sunindextype sVar3;
  sunindextype sVar4;
  int iVar5;
  int iVar6;
  realtype *prVar7;
  realtype *prVar8;
  realtype *prVar9;
  realtype *prVar10;
  realtype *prVar11;
  realtype *prVar12;
  long in_RCX;
  long in_R8;
  code *in_R9;
  realtype rVar13;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  int retval;
  sunindextype mlower;
  sunindextype mupper;
  sunindextype N;
  sunindextype i2;
  sunindextype i1;
  sunindextype ngroups;
  sunindextype width;
  sunindextype j;
  sunindextype i;
  sunindextype group;
  realtype *cns_data;
  realtype *ytemp_data;
  realtype *y_data;
  realtype *ftemp_data;
  realtype *fy_data;
  realtype *ewt_data;
  realtype *col_j;
  realtype conj;
  realtype srur;
  realtype inc_inv;
  realtype inc;
  realtype minInc;
  realtype fnorm;
  N_Vector ytemp;
  N_Vector ftemp;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  N_Vector in_stack_fffffffffffffef0;
  double local_108;
  int local_fc;
  double local_f8;
  double local_f0;
  realtype *local_e8;
  int local_bc;
  int local_b8;
  int local_b4;
  double local_60;
  
  sVar2 = SUNBandMatrix_Columns
                    ((SUNMatrix)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  sVar3 = SUNBandMatrix_UpperBandwidth
                    ((SUNMatrix)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  sVar4 = SUNBandMatrix_LowerBandwidth
                    ((SUNMatrix)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  prVar7 = N_VGetArrayPointer((N_Vector)0xeb4faf);
  prVar8 = N_VGetArrayPointer((N_Vector)0xeb4fc4);
  prVar9 = N_VGetArrayPointer((N_Vector)0xeb4fd9);
  prVar10 = N_VGetArrayPointer((N_Vector)0xeb4fee);
  prVar11 = N_VGetArrayPointer((N_Vector)0xeb5000);
  if (*(int *)(in_RCX + 0x80) == 0) {
    local_e8 = (realtype *)0x0;
  }
  else {
    local_e8 = N_VGetArrayPointer((N_Vector)0xeb502a);
  }
  N_VScale((realtype)in_stack_fffffffffffffef0,
           (N_Vector)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
           (N_Vector)0xeb5061);
  if (0.0 < *(double *)(in_RCX + 8)) {
    local_f0 = sqrt(*(double *)(in_RCX + 8));
  }
  else {
    local_f0 = 0.0;
  }
  rVar13 = N_VWrmsNorm(in_stack_fffffffffffffef0,
                       (N_Vector)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if ((rVar13 != 0.0) || (NAN(rVar13))) {
    local_f8 = ABS(*(double *)(in_RCX + 0x168)) * 1000.0 * *(double *)(in_RCX + 8) * (double)sVar2 *
               rVar13;
  }
  else {
    local_f8 = 1.0;
  }
  iVar5 = sVar4 + sVar3 + 1;
  local_fc = sVar2;
  if (iVar5 < sVar2) {
    local_fc = iVar5;
  }
  local_b4 = 1;
  while( true ) {
    if (local_fc < local_b4) {
      return 0;
    }
    for (local_bc = local_b4 + -1; local_bc < sVar2; local_bc = iVar5 + local_bc) {
      if (local_f0 * ABS(prVar10[local_bc]) <= local_f8 / prVar7[local_bc]) {
        local_108 = local_f8 / prVar7[local_bc];
      }
      else {
        local_108 = local_f0 * ABS(prVar10[local_bc]);
      }
      local_60 = local_108;
      if (*(int *)(in_RCX + 0x80) != 0) {
        dVar1 = local_e8[local_bc];
        if ((ABS(dVar1) != 1.0) || (NAN(ABS(dVar1)))) {
          if ((ABS(dVar1) == 2.0) &&
             ((!NAN(ABS(dVar1)) && ((prVar11[local_bc] + local_108) * dVar1 <= 0.0)))) {
            local_60 = -local_108;
          }
        }
        else if ((prVar11[local_bc] + local_108) * dVar1 < 0.0) {
          local_60 = -local_108;
        }
      }
      prVar11[local_bc] = local_60 + prVar11[local_bc];
    }
    iVar6 = (*in_R9)(*(undefined8 *)(in_RCX + 0x198),in_stack_00000010,in_stack_00000008,
                     *(undefined8 *)(in_RCX + 0x10));
    *(long *)(in_R8 + 0x88) = *(long *)(in_R8 + 0x88) + 1;
    if (iVar6 != 0) break;
    for (local_bc = local_b4 + -1; local_bc < sVar2; local_bc = iVar5 + local_bc) {
      prVar11[local_bc] = prVar10[local_bc];
      prVar12 = SUNBandMatrix_Column
                          ((SUNMatrix)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                           0);
      if (local_f0 * ABS(prVar10[local_bc]) <= local_f8 / prVar7[local_bc]) {
        local_60 = local_f8 / prVar7[local_bc];
      }
      else {
        local_60 = local_f0 * ABS(prVar10[local_bc]);
      }
      if (*(int *)(in_RCX + 0x80) != 0) {
        dVar1 = local_e8[local_bc];
        if ((ABS(dVar1) != 1.0) || (NAN(ABS(dVar1)))) {
          if ((ABS(dVar1) == 2.0) &&
             ((!NAN(ABS(dVar1)) && ((prVar11[local_bc] + local_60) * dVar1 <= 0.0)))) {
            local_60 = -local_60;
          }
        }
        else if ((prVar11[local_bc] + local_60) * dVar1 < 0.0) {
          local_60 = -local_60;
        }
      }
      if (local_bc - sVar3 < 0) {
        in_stack_fffffffffffffeec = 0;
      }
      else {
        in_stack_fffffffffffffeec = local_bc - sVar3;
      }
      local_b8 = in_stack_fffffffffffffeec;
      if (local_bc + sVar4 < sVar2 + -1) {
        in_stack_fffffffffffffee8 = local_bc + sVar4;
      }
      else {
        in_stack_fffffffffffffee8 = sVar2 + -1;
      }
      for (; local_b8 <= in_stack_fffffffffffffee8; local_b8 = local_b8 + 1) {
        prVar12[local_b8 - local_bc] = (1.0 / local_60) * (prVar9[local_b8] - prVar8[local_b8]);
      }
    }
    local_b4 = local_b4 + 1;
  }
  return iVar6;
}

Assistant:

int arkLsBandDQJac(realtype t, N_Vector y, N_Vector fy,
                   SUNMatrix Jac, ARKodeMem ark_mem,
                   ARKLsMem arkls_mem, ARKRhsFn fi,
                   N_Vector tmp1, N_Vector tmp2)
{
  N_Vector     ftemp, ytemp;
  realtype     fnorm, minInc, inc, inc_inv, srur, conj;
  realtype    *col_j, *ewt_data, *fy_data, *ftemp_data, *y_data, *ytemp_data;
  realtype    *cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  int          retval = 0;

  /* access matrix dimensions */
  N = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(ark_mem->ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  cns_data = (ark_mem->constraintsSet) ?
    N_VGetArrayPointer(ark_mem->constraints) : NULL;

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(ark_mem->uround);
  fnorm = N_VWrmsNorm(fy, ark_mem->rwt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(ark_mem->h) * ark_mem->uround * N * fnorm) : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group=1; group <= ngroups; group++) {

    /* Increment all y_j in group */
    for(j=group-1; j < N; j+=width) {
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (ark_mem->constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = fi(ark_mem->tcur, ytemp, ftemp, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval != 0) break;

    /* Restore ytemp, then form and load difference quotients */
    for (j=group-1; j < N; j+=width) {
      ytemp_data[j] = y_data[j];
      col_j = SUNBandMatrix_Column(Jac, j);
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (ark_mem->constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      inc_inv = ONE/inc;
      i1 = SUNMAX(0, j-mupper);
      i2 = SUNMIN(j+mlower, N-1);
      for (i=i1; i <= i2; i++)
        SM_COLUMN_ELEMENT_B(col_j,i,j) = inc_inv * (ftemp_data[i] - fy_data[i]);
    }
  }

  return(retval);
}